

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::record::IntegerBase<5u,9u>::print<std::back_insert_iterator<std::__cxx11::string>>
          (IntegerBase<5u,9u> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int value;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  local_38 = *(uint *)this;
  local_34 = MT;
  local_30 = MF;
  local_2c = MAT;
  tools::disco::Integer<5u>::write<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
            (&local_38,it);
  local_38 = *(uint *)(this + 4);
  tools::disco::Integer<5u>::write<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
            (&local_38,it);
  tools::disco::Column<1u>::write<std::back_insert_iterator<std::__cxx11::string>>(it);
  puVar1 = *(uint **)(this + 0x10);
  for (puVar2 = *(uint **)(this + 8); puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_38 = *puVar2;
    tools::disco::Integer<6u>::write<int,std::back_insert_iterator<std::__cxx11::string>>
              ((int *)&local_38,it);
  }
  tools::disco::Column<1u>::write<std::back_insert_iterator<std::__cxx11::string>>(it);
  for (iVar3 = (int)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 2) + -9; iVar3 != 0;
      iVar3 = iVar3 + 1) {
    tools::disco::Column<6u>::write<std::back_insert_iterator<std::__cxx11::string>>(it);
  }
  tools::disco::
  Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
            (it,&local_2c,&local_30,&local_34);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;

  record::Integer< 5 >::Parser::write( this->I(), it );
  record::Integer< 5 >::Parser::write( this->J(), it );

  if ( NDIGIT != 6 ) { disco::Column< 1 >::write( it ); };

  for ( auto value : this->K() ) {

    record::Integer< NDIGIT + 1 >::Parser::write( value, it );
  }

  switch ( NDIGIT ) {

    case 2: { disco::Column< 1 >::write( it ); break; }
    case 3: { disco::Column< 3 >::write( it ); break; }
    case 5: { disco::Column< 1 >::write( it ); break; }
    default: { /* unreachable */ break; }
  }

  int blankEntries = N - this->K().size();
  while ( blankEntries-- ){ disco::Column< NDIGIT + 1 >::write( it ); }

  using Format =
    disco::Record< disco::Integer< 4 >, disco::Integer< 2 >,
                   disco::Integer< 3 >, disco::Column< 5 > >;

  Format::write( it, MAT, MF, MT );
}